

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.h
# Opt level: O2

Token __thiscall
slang::parsing::NumberParser::parseReal<slang::parsing::Preprocessor>
          (NumberParser *this,Preprocessor *stream)

{
  real_t arg;
  NumericTokenFlags NVar1;
  SourceLocation location;
  Diagnostic *this_00;
  ulong uVar2;
  DiagCode missingCode;
  uint uVar3;
  double dVar4;
  size_t j;
  Token literal;
  size_type len;
  anon_class_40_5_86db9fac checkForDigit;
  string_view raw;
  
  literal = Preprocessor::consume(stream);
  NVar1 = Token::numericFlags(&literal);
  if ((NVar1.raw & 0x40) != 0) {
    dVar4 = Token::realValue(&literal);
    uVar3 = -(uint)(dVar4 == 0.0) & 1;
    location = Token::location(&literal);
    arg.v = *(double *)(&DAT_004a3830 + (ulong)uVar3 * 8);
    this_00 = addDiag(this,(DiagCode)(uVar3 * 0x10000 + 0xb0003),location);
    Diagnostic::operator<<(this_00,arg);
  }
  raw = Token::rawText(&literal);
  len = raw._M_len;
  uVar2 = 1;
  do {
    if (len <= uVar2 - 1) {
      return literal;
    }
    checkForDigit.literal = &literal;
    missingCode.subsystem = Numeric;
    missingCode.code = 5;
    j = uVar2;
    if (raw._M_str[uVar2 - 1] == 0x2e) {
LAB_0026a30a:
      checkForDigit.j = &j;
      checkForDigit.len = &len;
      checkForDigit.raw = &raw;
      checkForDigit.this = this;
      parseReal<slang::parsing::Preprocessor>::anon_class_40_5_86db9fac::operator()
                (&checkForDigit,missingCode);
    }
    else if ((raw._M_str[uVar2 - 1] & 0xdfU) == 0x45) {
      missingCode.subsystem = Numeric;
      missingCode.code = 4;
      if ((uVar2 < len) && ((raw._M_str[uVar2] == '-' || (raw._M_str[uVar2] == '+')))) {
        j = uVar2 + 1;
      }
      goto LAB_0026a30a;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

Token parseReal(TStream& stream) {
        // have to check for overflow here, now that we know this is actually a real
        auto literal = stream.consume();
        if (literal.numericFlags().outOfRange()) {
            if (literal.realValue() == 0) {
                addDiag(diag::RealLiteralUnderflow, literal.location())
                    << real_t(std::numeric_limits<double>::denorm_min());
            }
            else {
                SLANG_ASSERT(!std::isfinite(literal.realValue()));
                addDiag(diag::RealLiteralOverflow, literal.location())
                    << real_t(std::numeric_limits<double>::max());
            }
        }

        // Enforce extra rules about where digits and underscores
        // are allowed to go in a real literal.
        auto raw = literal.rawText();
        auto len = raw.length();
        for (size_t i = 0; i < len; i++) {
            char c = raw[i];
            size_t j = i + 1;

            auto checkForDigit = [&](DiagCode missingCode) {
                if (j == len || !isDecimalDigit(raw[j])) {
                    auto code = (j < len && raw[j] == '_') ? diag::DigitsLeadingUnderscore
                                                           : missingCode;
                    addDiag(code, literal.location() + j);
                }
            };

            if (c == '.') {
                checkForDigit(diag::MissingFractionalDigits);
            }
            else if (c == 'e' || c == 'E') {
                if (j < len && (raw[j] == '+' || raw[j] == '-'))
                    j++;

                checkForDigit(diag::MissingExponentDigits);
            }
        }

        return literal;
    }